

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

void __thiscall QWizardPrivate::_q_emitCustomButtonClicked(QWizardPrivate *this)

{
  QWizard *this_00;
  long lVar1;
  long lVar2;
  
  this_00 = *(QWizard **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  lVar1 = QObject::sender();
  lVar2 = 0;
  while( true ) {
    if (lVar2 == 3) {
      return;
    }
    if (*(long *)((long)&this->field_20 + lVar2 * 8 + 0x30) == lVar1) break;
    lVar2 = lVar2 + 1;
  }
  QWizard::customButtonClicked(this_00,(int)lVar2 + 6);
  return;
}

Assistant:

void QWizardPrivate::_q_emitCustomButtonClicked()
{
    Q_Q(QWizard);
    QObject *button = q->sender();
    for (int i = QWizard::NStandardButtons; i < QWizard::NButtons; ++i) {
        if (btns[i] == button) {
            emit q->customButtonClicked(QWizard::WizardButton(i));
            break;
        }
    }
}